

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  ulong uVar1;
  uint32_t uVar2;
  long *plVar3;
  ulong *puVar4;
  Nonnull<const_char_*> pcVar5;
  undefined8 extraout_RAX;
  string temp;
  long *local_60 [2];
  long local_50 [2];
  Message *local_40;
  Message *local_38;
  
  Reflection::VerifyFieldType<google::protobuf::internal::InlinedStringField>(r,field);
  local_38 = lhs;
  plVar3 = (long *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::VerifyFieldType<google::protobuf::internal::InlinedStringField>(r,field);
  puVar4 = (ulong *)Reflection::MutableRawImpl(r,rhs,field);
  this = &r->schema_;
  uVar2 = ReflectionSchema::InlinedStringIndex(this,field);
  if (uVar2 == 0) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if ((r->schema_).inlined_string_donated_offset_ == -1) {
      SwapInlinedStrings<false>((SwapFieldHelper *)local_60);
    }
    else {
      ReflectionSchema::InlinedStringDonatedOffset(this);
      if ((r->schema_).inlined_string_donated_offset_ != -1) {
        local_40 = rhs;
        ReflectionSchema::InlinedStringDonatedOffset(this);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char*>((string *)local_60,*plVar3,plVar3[1] + *plVar3);
        uVar1 = *puVar4;
        Reflection::IsInlinedStringDonated(r,local_38,field);
        std::__cxx11::string::_M_replace((ulong)plVar3,0,(char *)plVar3[1],uVar1);
        plVar3 = local_60[0];
        Reflection::IsInlinedStringDonated(r,local_40,field);
        std::__cxx11::string::_M_replace((ulong)puVar4,0,(char *)puVar4[1],(ulong)plVar3);
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        return;
      }
    }
    SwapInlinedStrings<false>((SwapFieldHelper *)local_60);
  }
  SwapInlinedStrings<false>();
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}